

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
NoiseStrengthSolver_GetCentersTwoBins10bit_Test::TestBody
          (NoiseStrengthSolver_GetCentersTwoBins10bit_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_noise_strength_solver_t solver;
  double in_stack_000000f0;
  double in_stack_000000f8;
  double in_stack_00000100;
  char *in_stack_00000108;
  char *in_stack_00000110;
  char *in_stack_00000118;
  aom_noise_strength_solver_t *in_stack_ffffffffffffff28;
  AssertHelper *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined8 in_stack_ffffffffffffff48;
  int line;
  aom_noise_strength_solver_t *solver_00;
  AssertionResult *this_01;
  Type type;
  undefined7 in_stack_ffffffffffffff60;
  AssertionResult local_88 [3];
  Message *in_stack_ffffffffffffffa8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffb0;
  aom_noise_strength_solver_t local_48;
  
  line = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  solver_00 = &local_48;
  aom_noise_strength_solver_init(in_stack_ffffffffffffff28,0,0x59bc1b);
  aom_noise_strength_solver_get_center(solver_00,0);
  this_01 = (AssertionResult *)&stack0xffffffffffffffa8;
  testing::internal::DoubleNearPredFormat
            (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
             in_stack_000000f8,in_stack_000000f0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  type = (Type)((ulong)this_01 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff60));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x59bca7);
    line = (int)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff60),type,(char *)solver_00,line
               ,(char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffb0._M_head_impl,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff30);
    testing::Message::~Message((Message *)0x59bcf5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x59bd38);
  aom_noise_strength_solver_get_center(&local_48,1);
  testing::internal::DoubleNearPredFormat
            (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
             in_stack_000000f8,in_stack_000000f0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_88);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff60));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x59bddb)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff60),type,(char *)solver_00,line
               ,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff40));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffb0._M_head_impl,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x59be29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x59be69);
  aom_noise_strength_solver_free((aom_noise_strength_solver_t *)0x59be76);
  return;
}

Assistant:

TEST(NoiseStrengthSolver, GetCentersTwoBins10bit) {
  aom_noise_strength_solver_t solver;
  aom_noise_strength_solver_init(&solver, 2, 10);
  EXPECT_NEAR(0, aom_noise_strength_solver_get_center(&solver, 0), 1e-5);
  EXPECT_NEAR(1023, aom_noise_strength_solver_get_center(&solver, 1), 1e-5);
  aom_noise_strength_solver_free(&solver);
}